

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseMessage<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg,bool any_reparse)

{
  int *piVar1;
  JsonLocation *pJVar2;
  pointer *ppCVar3;
  anon_union_80_2_a3c22f61_for_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>_3
  *this_00;
  void *pvVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  ZeroCopyInputStream *pZVar8;
  pointer pcVar9;
  _Alloc_hider _Var10;
  undefined1 auVar11 [16];
  bool bVar12;
  char cVar13;
  bool bVar14;
  MessageType MVar15;
  int iVar16;
  size_t *psVar17;
  Field pFVar18;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_00;
  string *psVar19;
  _Storage<const_google::protobuf::json_internal::ResolverPool::Field_*,_true> msg_01;
  size_type sVar20;
  optional<unsigned_int> oVar21;
  optional<unsigned_int> oVar22;
  _Optional_payload_base<int> _Var23;
  optional<unsigned_int> oVar24;
  optional<unsigned_int> oVar25;
  optional<unsigned_int> oVar26;
  optional<int> oVar27;
  ulong uVar28;
  uint *out_00;
  char *pcVar29;
  undefined8 *puVar30;
  ulong uVar31;
  long lVar32;
  char cVar33;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  *this_01;
  undefined7 in_register_00000081;
  _Storage<unsigned_int,_true> _Var34;
  MessagePath *pMVar35;
  size_type __n;
  uint uVar36;
  string_view literal;
  string_view literal_00;
  string_view url;
  string_view literal_01;
  string_view literal_02;
  string_view url_00;
  string_view url_01;
  string_view literal_03;
  string_view literal_04;
  string_view literal_05;
  string_view str;
  string_view literal_06;
  string_view literal_07;
  string_view prefix;
  string_view suffix;
  string_view name;
  string_view prefix_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view text;
  optional<const_google::protobuf::json_internal::ResolverPool::Field_*> oVar37;
  string_view sVar38;
  basic_string_view<char,_std::char_traits<char>_> bVar39;
  basic_string_view<char,_std::char_traits<char>_> bVar40;
  string_view x;
  string_view x_00;
  string_view x_01;
  string_view end;
  string_view x_02;
  string_view x_03;
  string_view x_04;
  string_view end_00;
  string_view end_01;
  string_view end_02;
  string_view end_03;
  string_view end_04;
  string_view end_05;
  string_view end_06;
  undefined8 uStack_2a0;
  Status *_status;
  char *local_280;
  _Storage<unsigned_int,_true> local_270;
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  key;
  optional<google::protobuf::json_internal::MaybeOwnedString> type_url;
  JsonLexer any_lex;
  undefined1 local_110 [16];
  InternalMetadata local_100;
  LocationWith<google::protobuf::json_internal::Mark> mark;
  string out;
  StringOutputStream stream;
  ArrayInputStream in;
  
  psVar17 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  sVar38._M_str = (char *)desc;
  sVar38._M_len = *psVar17;
  pcVar29 = (char *)CONCAT71(in_register_00000081,any_reparse);
  MVar15 = ClassifyMessage((json_internal *)psVar17[1],sVar38);
  if ((int)(char *)CONCAT71(in_register_00000081,any_reparse) != 0) goto switchD_0028f91d_caseD_3;
  if (MVar15 != kValue) {
    if (MVar15 == kStruct) {
      ParseStructValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
      return (Status)this;
    }
    if (MVar15 != kAny) {
      bVar12 = JsonLexer::Peek(lex,kObj);
      if ((bVar12) && ((lex->options_).allow_legacy_syntax != false)) {
switchD_0028f91d_caseD_3:
        JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
        if (*(long *)this != 1) {
          return (Status)this;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        JsonLexer::Push((JsonLexer *)this);
        if (*(long *)this != 1) {
          return (Status)this;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        literal._M_str = "}";
        literal._M_len = 1;
        bVar12 = JsonLexer::Peek(lex,literal);
        if (bVar12) {
          piVar1 = &(lex->options_).recursion_depth;
          *piVar1 = *piVar1 + 1;
        }
        else {
          pJVar2 = &lex->json_loc_;
          bVar12 = true;
          do {
            if (bVar12 == false) {
              pcVar29 = "expected \',\'";
              goto LAB_0028fe64;
            }
            JsonLexer::SkipToToken((JsonLexer *)this);
            if (*(long *)this != 1) {
              return (Status)this;
            }
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::
            StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::StatusOr(&key);
            cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
            if ((cVar13 == '\"') ||
               (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
              JsonLexer::ParseUtf8
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&any_lex,lex);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::operator=(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&any_lex);
LAB_0028f9cf:
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               *)&any_lex);
              absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
              if (*(long *)this != 1) goto LAB_0028fe08;
              absl::lts_20240722::Status::~Status((Status *)this);
              JsonLexer::Expect((JsonLexer *)this,lex,1,":");
              if (*(long *)this != 1) goto LAB_0028fe08;
              absl::lts_20240722::Status::~Status((Status *)this);
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              if (any_reparse) {
                bVar14 = json_internal::operator==
                                   (&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1.data_.value,(char (*) [6])"@type");
                if (!bVar14) {
                  if (MVar15 == kNotWellKnown) goto LAB_0028faf8;
                  bVar14 = json_internal::operator!=
                                     (&key.
                                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                       .field_1.data_.value,(char (*) [6])0x3b608b);
                  if (bVar14) {
                    JsonLocation::Invalid
                              ((JsonLocation *)this,pJVar2,0x37,
                               "fields in a well-known-typed Any must be @type or value");
                  }
                  else {
                    ParseMessage<google::protobuf::json_internal::ParseProto3Type>
                              (this,lex,desc,msg,false);
                  }
                  goto LAB_0028fddc;
                }
                JsonLexer::SkipValue((JsonLexer *)this);
                if (*(long *)this != 1) goto LAB_0028fe08;
                absl::lts_20240722::Status::~Status((Status *)this);
                *(undefined8 *)this = 1;
              }
              else {
LAB_0028faf8:
                psVar19 = MaybeOwnedString::ToString_abi_cxx11_
                                    (&key.
                                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                      .field_1.data_.value);
                out._M_string_length = (size_type)(psVar19->_M_dataplus)._M_p;
                out._M_dataplus._M_p = (pointer)psVar19->_M_string_length;
                prefix._M_str = "[";
                prefix._M_len = 1;
                pcVar29 = "[";
                text._M_str = (char *)out._M_string_length;
                text._M_len = (size_t)psVar19->_M_string_length;
                bVar14 = absl::lts_20240722::StartsWith(text,prefix);
                if (bVar14) {
                  suffix._M_str = "]";
                  suffix._M_len = 1;
                  pcVar29 = "]";
                  bVar14 = absl::lts_20240722::EndsWith((string_view)out._0_16_,suffix);
                  if (!bVar14) goto LAB_0028fb73;
                  std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)&out,1,
                             (size_type)(out._M_dataplus._M_p + -2));
                }
                else {
LAB_0028fb73:
                  name._M_str = pcVar29;
                  name._M_len = out._M_string_length;
                  oVar37 = Proto3Type::FieldByName
                                     ((Proto3Type *)desc,(Desc *)out._M_dataplus._M_p,name);
                  auVar11 = (undefined1  [16])out._0_16_;
                  msg_01 = oVar37.
                           super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
                           ._M_payload.
                           super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>
                           ._M_payload;
                  if (((undefined1  [16])
                       oVar37.
                       super__Optional_base<const_google::protobuf::json_internal::ResolverPool::Field_*,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<const_google::protobuf::json_internal::ResolverPool::Field_*>
                      & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                    pMVar35 = lex->path_;
                    _Var10._M_p = out._M_dataplus._M_p;
                    iVar16 = ((msg_01._M_value)->raw_->field_0)._impl_.kind_;
                    sVar38 = Proto3Type::FieldTypeName(msg_01._M_value);
                    any_lex.stream_.last_chunk_._M_len._0_4_ = (int)sVar38._M_len;
                    any_lex.stream_.last_chunk_._M_len._4_4_ = sVar38._M_len._4_4_;
                    any_lex.stream_.last_chunk_._M_str._0_1_ = sVar38._M_str._0_1_;
                    any_lex.stream_.last_chunk_._M_str._1_7_ = sVar38._M_str._1_7_;
                    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start = _Var10._M_p;
                    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_1_ = auVar11[8];
                    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish._1_7_ = auVar11._9_7_;
                    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
                    any_lex.stream_.stream_._0_4_ = iVar16;
                    std::
                    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
                              (&pMVar35->components_,(Component *)&any_lex);
                    bVar14 = ParseProto3Type::HasParsed
                                       (msg_01._M_value,msg,(lex->options_).allow_legacy_syntax);
                    if ((!bVar14) || (bVar14 = JsonLexer::Peek(lex,kNull), bVar14)) {
                      bVar14 = Proto3Type::IsMap(msg_01._M_value);
                      if (bVar14) {
                        ParseMap<google::protobuf::json_internal::ParseProto3Type>
                                  ((JsonLexer *)this,
                                   (Field<google::protobuf::json_internal::ParseProto3Type>)lex,
                                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                                   msg_01._M_value);
                      }
                      else if ((((msg_01._M_value)->raw_->field_0)._impl_.cardinality_ == 3) &&
                              (((lex->options_).allow_legacy_syntax != true ||
                               (bVar14 = JsonLexer::Peek(lex,kArr), bVar14)))) {
                        ParseArray<google::protobuf::json_internal::ParseProto3Type>
                                  ((JsonLexer *)this,
                                   (Field<google::protobuf::json_internal::ParseProto3Type>)lex,
                                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                                   msg_01._M_value);
                      }
                      else {
                        ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                                  ((JsonLexer *)this,
                                   (Field<google::protobuf::json_internal::ParseProto3Type>)lex,
                                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                                   msg_01._M_value);
                      }
                    }
                    else {
                      type_url.
                      super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                      ._M_payload.
                      super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                      .
                      super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                      ._M_payload._0_8_ = anon_var_dwarf_6ff9e9;
                      type_url.
                      super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                      ._M_payload.
                      super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                      .
                      super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                      ._M_payload._8_8_ = 0x41;
                      absl::lts_20240722::
                      StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                                ((string *)&any_lex,
                                 (FormatSpec<std::basic_string_view<char>_> *)&type_url,
                                 (basic_string_view<char,_std::char_traits<char>_> *)&out);
                      JsonLocation::Invalid
                                ((JsonLocation *)this,pJVar2,
                                 CONCAT44(any_lex.stream_.last_chunk_._M_len._4_4_,
                                          (int)any_lex.stream_.last_chunk_._M_len),
                                 CONCAT44(any_lex.stream_.stream_._4_4_,(int)any_lex.stream_.stream_
                                         ));
                      std::__cxx11::string::~string((string *)&any_lex);
                    }
                    ppCVar3 = &(pMVar35->components_).
                               super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppCVar3 = *ppCVar3 + -1;
                    goto LAB_0028fddc;
                  }
                }
                if ((lex->options_).ignore_unknown_fields == false) {
                  type_url.
                  super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                  ._M_payload.
                  super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                  .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
                  _M_payload._0_8_ = anon_var_dwarf_6ff9dc;
                  type_url.
                  super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                  ._M_payload.
                  super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                  .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
                  _M_payload._8_8_ = 0x13;
                  absl::lts_20240722::
                  StrFormat<std::basic_string_view<char,_std::char_traits<char>_>_>
                            ((string *)&any_lex,
                             (FormatSpec<std::basic_string_view<char>_> *)&type_url,
                             (basic_string_view<char,_std::char_traits<char>_> *)&out);
                  JsonLocation::Invalid
                            ((JsonLocation *)this,pJVar2,
                             CONCAT44(any_lex.stream_.last_chunk_._M_len._4_4_,
                                      (int)any_lex.stream_.last_chunk_._M_len),
                             CONCAT44(any_lex.stream_.stream_._4_4_,(int)any_lex.stream_.stream_));
                  std::__cxx11::string::~string((string *)&any_lex);
                }
                else {
                  JsonLexer::SkipValue((JsonLexer *)this);
                }
LAB_0028fddc:
                if (*(long *)this != 1) goto LAB_0028fe08;
              }
              absl::lts_20240722::Status::~Status((Status *)this);
              literal_01._M_str = ",";
              literal_01._M_len = 1;
              bVar12 = JsonLexer::Peek(lex,literal_01);
              bVar14 = true;
            }
            else {
              if ((lex->options_).allow_legacy_syntax == true) {
                JsonLexer::ParseBareWord
                          ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&any_lex,lex);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator=(&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)&any_lex);
                goto LAB_0028f9cf;
              }
              JsonLocation::Invalid((JsonLocation *)this,pJVar2,0xc,"expected \'\"\'");
LAB_0028fe08:
              bVar14 = false;
            }
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::~StatusOrData(&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           );
            if (!bVar14) {
              return (Status)this;
            }
            literal_02._M_str = "}";
            literal_02._M_len = 1;
            bVar14 = JsonLexer::Peek(lex,literal_02);
          } while (!bVar14);
          piVar1 = &(lex->options_).recursion_depth;
          *piVar1 = *piVar1 + 1;
          if (((lex->options_).allow_legacy_syntax == false) && (bVar12 != false)) {
            pcVar29 = "expected \'}\'";
LAB_0028fe64:
            JsonLocation::Invalid((JsonLocation *)this,pJVar2,0xc,pcVar29);
            return (Status)this;
          }
        }
        *(undefined8 *)this = 1;
        return (Status)this;
      }
      out_00 = &switchD_0028f91d::switchdataD_003b2038;
      switch(MVar15) {
      case kWrapper:
        msg_00 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
                 Proto3Type::MustHaveField(desc,1);
        ParseSingular<google::protobuf::json_internal::ParseProto3Type>
                  ((JsonLexer *)this,(Field<google::protobuf::json_internal::ParseProto3Type>)lex,
                   msg_00);
        return (Status)this;
      default:
        goto switchD_0028f91d_caseD_3;
      case kList:
        ParseListValue<google::protobuf::json_internal::ParseProto3Type>(this,lex,desc,msg);
        return (Status)this;
      case kTimestamp:
        bVar12 = JsonLexer::Peek(lex,kNull);
        if (bVar12) {
LAB_0028ff48:
          JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
          return (Status)this;
        }
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView
                           (&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
        any_lex.stream_.stream_._0_4_ = (int)sVar38._M_len;
        any_lex.stream_.stream_._4_4_ = sVar38._M_len._4_4_;
        any_lex.stream_.last_chunk_._M_len._0_4_ = (int)sVar38._M_str;
        any_lex.stream_.last_chunk_._M_len._4_4_ = sVar38._M_str._4_4_;
        if (sVar38._M_len < 0x14) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x1a,"timestamp string too short");
          break;
        }
        end._M_str = pcVar29;
        end._M_len = (size_t)"-";
        oVar21 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x4,1,end);
        if ((oVar21.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_engaged &
            oVar21.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload != 0) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x15,"bad year in timestamp");
          break;
        }
        end_00._M_str = pcVar29;
        end_00._M_len = (size_t)"-";
        oVar22 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x2,1,end_00);
        _Var34._M_value =
             oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
        if (((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
            _Var34._M_value == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x16,"bad month in timestamp");
          break;
        }
        end_01._M_str = pcVar29;
        end_01._M_len = (size_t)"T";
        oVar22 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x2,1,end_01);
        if (((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
            oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x14,"bad day in timestamp");
          break;
        }
        end_02._M_str = pcVar29;
        end_02._M_len = (size_t)":";
        oVar24 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x2,1,end_02);
        if (((ulong)oVar24.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x16,"bad hours in timestamp");
          break;
        }
        end_03._M_str = pcVar29;
        end_03._M_len = (size_t)":";
        oVar25 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x2,1,end_03);
        if (((ulong)oVar25.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x18,"bad minutes in timestamp");
          break;
        }
        end_04._M_str = pcVar29;
        end_04._M_len = (size_t)"";
        oVar26 = TakeTimeDigitsWithSuffixAndAdvance
                           ((anon_unknown_5 *)&any_lex,(string_view *)0x2,0,end_04);
        if (((ulong)oVar26.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x18,"bad seconds in timestamp");
          break;
        }
        iVar16 = _Var34._M_value + 9;
        if (2 < _Var34._M_value) {
          iVar16 = _Var34._M_value - 3;
        }
        uVar36 = (oVar21.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int>._M_payload -
                 (uint)(_Var34._M_value < 3)) + 0x12c0;
        oVar27 = TakeNanosAndAdvance((string_view *)&any_lex);
        if (((ulong)oVar27.super__Optional_base<int,_true,_true>._M_payload.
                    super__Optional_payload_base<int> & 0x100000000) == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar29 = "timestamp had bad nanoseconds";
          uStack_2a0 = 0x1d;
        }
        else {
          lVar7 = CONCAT44(any_lex.stream_.stream_._4_4_,(int)any_lex.stream_.stream_);
          if (lVar7 != 0) {
            local_270._M_value =
                 oVar25.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_payload;
            lVar32 = ((ulong)oVar26.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int> & 0xffffffff) +
                     (ulong)(local_270._M_value * 0x3c) +
                     (ulong)(oVar24.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                             super__Optional_payload_base<unsigned_int>._M_payload * 0xe10) +
                     (long)(int)(oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload +
                                 uVar36 / 400 + uVar36 * 0x16d + ((uVar36 >> 2) - uVar36 / 100) +
                                 (iVar16 * 0xf4ff + 0x301U >> 0xb) + -0x25bab9) * 0x15180;
            cVar13 = *(char *)CONCAT44(any_lex.stream_.last_chunk_._M_len._4_4_,
                                       (int)any_lex.stream_.last_chunk_._M_len);
            if (cVar13 == '+') {
              bVar12 = false;
LAB_00291390:
              if (lVar7 == 6) {
                bVar39 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                                   ((basic_string_view<char,_std::char_traits<char>_> *)&any_lex,1,
                                    0xffffffffffffffff);
                any_lex.stream_.stream_._0_4_ = (int)bVar39._M_len;
                any_lex.stream_.stream_._4_4_ = bVar39._M_len._4_4_;
                any_lex.stream_.last_chunk_._M_len._0_4_ = (int)bVar39._M_str;
                any_lex.stream_.last_chunk_._M_len._4_4_ = bVar39._M_str._4_4_;
                end_05._M_str = pcVar29;
                end_05._M_len = (size_t)":";
                oVar21 = TakeTimeDigitsWithSuffixAndAdvance
                                   ((anon_unknown_5 *)&any_lex,(string_view *)0x2,1,end_05);
                end_06._M_str = pcVar29;
                end_06._M_len = (size_t)"";
                oVar22 = TakeTimeDigitsWithSuffixAndAdvance
                                   ((anon_unknown_5 *)&any_lex,(string_view *)0x2,0,end_06);
                if (((ulong)oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) == 0 ||
                    ((ulong)oVar21.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0x100000000) == 0) {
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,
                             (undefined1 *)
                             ((long)&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1 + 0x30),0x2a,
                             "timestamp offset has bad hours and minutes");
                  break;
                }
                uVar28 = (ulong)((oVar22.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                  super__Optional_payload_base<unsigned_int>._M_payload +
                                 oVar21.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload * 0x3c) *
                                0x3c);
                uVar31 = -uVar28;
                if (bVar12) {
                  uVar31 = uVar28;
                }
                lVar32 = lVar32 + uVar31;
LAB_00291464:
                pFVar18 = Proto3Type::MustHaveField(desc,1);
                ParseProto3Type::
                SetInt<long,(google::protobuf::Field_Kind)3,(google::protobuf::Field_Kind)16,(google::protobuf::Field_Kind)18>
                          (pFVar18,msg,lVar32);
                pFVar18 = Proto3Type::MustHaveField(desc,2);
                ParseProto3Type::
                SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
                          (pFVar18,msg,
                           oVar27.super__Optional_base<int,_true,_true>._M_payload.
                           super__Optional_payload_base<int>._M_payload);
                goto LAB_00291175;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              pcVar29 = "timestamp offset of wrong size.";
              uStack_2a0 = 0x1f;
            }
            else {
              if (cVar13 == 'Z') {
                if (lVar7 == 1) goto LAB_00291464;
              }
              else if (cVar13 == '-') {
                bVar12 = true;
                goto LAB_00291390;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              pcVar29 = "bad timezone offset";
              uStack_2a0 = 0x13;
            }
            JsonLocation::Invalid
                      ((JsonLocation *)this,
                       (undefined1 *)
                       ((long)&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               .field_1 + 0x30),uStack_2a0,pcVar29);
            break;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar29 = "timestamp missing timezone offset";
          uStack_2a0 = 0x21;
        }
        JsonLocation::Invalid
                  ((JsonLocation *)this,
                   (undefined1 *)
                   ((long)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_1 + 0x30),uStack_2a0,pcVar29);
        break;
      case kDuration:
        bVar12 = JsonLexer::Peek(lex,kNull);
        if (bVar12) goto LAB_0028ff48;
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        this_00 = &key.
                   super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   .field_1;
        sVar38 = MaybeOwnedString::AsView(&(this_00->data_).value);
        sVar20 = 0;
        while ((__n = sVar38._M_len, sVar38._M_len != sVar20 &&
               (cVar13 = sVar38._M_str[sVar20],
               out_00 = (uint *)CONCAT71((int7)((ulong)out_00 >> 8),cVar13 != '-'), __n = sVar20,
               cVar13 == '-' || (byte)(cVar13 - 0x30U) < 10))) {
          sVar20 = sVar20 + 1;
        }
        if (__n == 0) {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          JsonLocation::Invalid
                    ((JsonLocation *)this,
                     (undefined1 *)
                     ((long)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1 + 0x30),0x23,"duration must start with an integer");
          break;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView(&(this_00->data_).value);
        any_lex.stream_.stream_._0_4_ = (int)sVar38._M_len;
        any_lex.stream_.stream_._4_4_ = sVar38._M_len._4_4_;
        any_lex.stream_.last_chunk_._M_len._0_4_ = (int)sVar38._M_str;
        any_lex.stream_.last_chunk_._M_len._4_4_ = sVar38._M_str._4_4_;
        bVar39 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           ((basic_string_view<char,_std::char_traits<char>_> *)&any_lex,0,__n);
        str._M_str = (char *)&type_url;
        str._M_len = (size_t)bVar39._M_str;
        bVar12 = absl::lts_20240722::SimpleAtoi<long>
                           ((lts_20240722 *)bVar39._M_len,str,(Nonnull<long_*>)out_00);
        if (bVar12) {
          if (0xffffff6d0c68c3fe <
              type_url.
              super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
              _M_payload.
              super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
              .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
              _M_payload._0_8_ - 0x4979cb9e01) {
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::EnsureOk(&key.
                        super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      );
            out._0_16_ = MaybeOwnedString::AsView(&(this_00->data_).value);
            bVar40 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                               ((basic_string_view<char,_std::char_traits<char>_> *)&out,__n,
                                0xffffffffffffffff);
            any_lex.stream_.stream_._0_4_ = (int)bVar40._M_len;
            any_lex.stream_.stream_._4_4_ = bVar40._M_len._4_4_;
            any_lex.stream_.last_chunk_._M_len._0_4_ = (int)bVar40._M_str;
            any_lex.stream_.last_chunk_._M_len._4_4_ = bVar40._M_str._4_4_;
            _Var23 = (_Optional_payload_base<int>)TakeNanosAndAdvance((string_view *)&any_lex);
            if (((ulong)_Var23 >> 0x20 & 1) == 0) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              JsonLocation::Invalid
                        ((JsonLocation *)this,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),0x1c,"duration had bad nanoseconds");
              break;
            }
            if (((long)type_url.
                       super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                       ._M_payload.
                       super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                       .
                       super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                       ._M_payload._0_8_ < 0) ||
               (prefix_00._M_str = "-", prefix_00._M_len = 1,
               bVar12 = absl::lts_20240722::StartsWith(bVar39,prefix_00), bVar12)) {
              _Var23._M_payload = -_Var23._M_payload._M_value;
              _Var23._4_4_ = 0;
            }
            bVar39._M_len._4_4_ = any_lex.stream_.stream_._4_4_;
            bVar39._M_len._0_4_ = (int)any_lex.stream_.stream_;
            bVar39._M_str._0_4_ = (int)any_lex.stream_.last_chunk_._M_len;
            bVar39._M_str._4_4_ = any_lex.stream_.last_chunk_._M_len._4_4_;
            __y._M_str = "s";
            __y._M_len = 1;
            bVar12 = std::operator!=(bVar39,__y);
            if (bVar12) {
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::EnsureOk(&key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              JsonLocation::Invalid
                        ((JsonLocation *)this,
                         (undefined1 *)
                         ((long)&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                 .field_1 + 0x30),0x23,"duration must end with a single \'s\'");
              break;
            }
            pFVar18 = Proto3Type::MustHaveField(desc,1);
            ParseProto3Type::
            SetInt<long,(google::protobuf::Field_Kind)3,(google::protobuf::Field_Kind)16,(google::protobuf::Field_Kind)18>
                      (pFVar18,msg,
                       type_url.
                       super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                       ._M_payload.
                       super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                       .
                       super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                       ._M_payload._0_8_);
            pFVar18 = Proto3Type::MustHaveField(desc,2);
            ParseProto3Type::
            SetInt<int,(google::protobuf::Field_Kind)5,(google::protobuf::Field_Kind)15,(google::protobuf::Field_Kind)17>
                      (pFVar18,msg,_Var23._M_payload._M_value);
            goto LAB_00291175;
          }
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar29 = "duration out of range";
          uStack_2a0 = 0x15;
        }
        else {
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk(&key.
                      super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    );
          pcVar29 = "duration had bad seconds";
          uStack_2a0 = 0x18;
        }
        JsonLocation::Invalid
                  ((JsonLocation *)this,
                   (undefined1 *)
                   ((long)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                           .field_1 + 0x30),uStack_2a0,pcVar29);
        break;
      case kFieldMask:
        JsonLexer::ParseUtf8(&key,lex);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
        if (*(long *)this != 1) break;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::EnsureOk(&key.
                    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  );
        sVar38 = MaybeOwnedString::AsView
                           (&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             .field_1.data_.value);
        if (sVar38._M_len != 0) {
          pFVar18 = Proto3Type::MustHaveField(desc,1);
          mark.loc.offset._0_1_ = 0x2c;
          mark.value = (Mark)sVar38;
          absl::lts_20240722::strings_internal::
          Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::begin((const_iterator *)&any_lex,
                  (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   *)&mark);
          absl::lts_20240722::strings_internal::
          Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
          ::end((const_iterator *)&out,
                (Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
                 *)&mark);
          while ((pcVar9 = any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                 (int)any_lex.stream_.last_chunk_._M_len != (int)out._M_string_length ||
                 ((pointer)CONCAT44(any_lex.stream_.stream_._4_4_,(int)any_lex.stream_.stream_) !=
                  out._M_dataplus._M_p))) {
            type_url.
            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
            _M_payload.
            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
            .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
            _M_payload._0_8_ =
                 (long)&type_url.
                        super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                        ._M_payload.
                        super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                        .
                        super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                        ._M_payload + 0x10;
            type_url.
            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
            _M_payload.
            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
            .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
            _M_payload._8_8_ = 0;
            lVar7 = CONCAT71(any_lex.stream_.last_chunk_._M_str._1_7_,
                             any_lex.stream_.last_chunk_._M_str._0_1_);
            type_url.
            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
            _M_payload.
            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
            .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
            _M_payload._16_1_ = 0;
            std::__cxx11::string::reserve((ulong)&type_url);
            for (lVar32 = 0; lVar7 != lVar32; lVar32 = lVar32 + 1) {
              cVar13 = pcVar9[lVar32];
              cVar33 = (char)(string *)&type_url;
              if ((9 < (byte)(cVar13 - 0x30U)) && (cVar13 != '.' && 0x19 < (byte)(cVar13 + 0x9fU)))
              {
                if ((byte)(cVar13 + 0xbfU) < 0x1a) {
                  std::__cxx11::string::push_back(cVar33);
                }
                else if ((lex->options_).allow_legacy_syntax == false) {
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,
                             (undefined1 *)
                             ((long)&key.
                                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                     .field_1 + 0x30),0x21,"unexpected character in FieldMask");
                  std::__cxx11::string::~string((string *)&type_url);
                  goto LAB_00291180;
                }
              }
              std::__cxx11::string::push_back(cVar33);
            }
            x_00._M_str = pcVar29;
            x_00._M_len = type_url.
                          super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                          ._M_payload._0_8_;
            ParseProto3Type::SetString
                      ((ParseProto3Type *)pFVar18,(Field)msg,
                       (Msg *)type_url.
                              super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                              ._M_payload.
                              super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                              .
                              super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                              ._M_payload._8_8_,x_00);
            std::__cxx11::string::~string((string *)&type_url);
            absl::lts_20240722::strings_internal::
            SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::operator++((SplitIterator<absl::lts_20240722::strings_internal::Splitter<absl::lts_20240722::ByChar,_absl::lts_20240722::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          *)&any_lex);
          }
        }
LAB_00291175:
        *(undefined8 *)this = 1;
      }
LAB_00291180:
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
      return (Status)this;
    }
    JsonLexer::SkipToToken((JsonLexer *)this);
    if (*(long *)this != 1) {
      return (Status)this;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    JsonLexer::BeginMark(&mark,lex);
    type_url.super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
    _M_payload.
    super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>.
    super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>._M_engaged =
         false;
    JsonLexer::Expect((JsonLexer *)this,lex,1,"{");
    if (*(long *)this != 1) goto LAB_00290d4c;
    absl::lts_20240722::Status::~Status((Status *)this);
    JsonLexer::Push((JsonLexer *)this);
    if (*(long *)this != 1) goto LAB_00290d4c;
    absl::lts_20240722::Status::~Status((Status *)this);
    literal_00._M_str = "}";
    literal_00._M_len = 1;
    bVar12 = JsonLexer::Peek(lex,literal_00);
    if (bVar12) {
      piVar1 = &(lex->options_).recursion_depth;
      *piVar1 = *piVar1 + 1;
LAB_0028f5ab:
      *(undefined8 *)this = 1;
    }
    else {
      bVar12 = true;
      local_280 = "expected \',\'";
      do {
        if (bVar12 == false) goto LAB_00290853;
        JsonLexer::SkipToToken((JsonLexer *)this);
        if (*(long *)this != 1) goto LAB_00290d4c;
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::
        StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    *)&any_lex);
        cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_);
        if ((cVar13 == '\"') ||
           (cVar13 = ZeroCopyBufferedStream::PeekChar(&lex->stream_), cVar13 == '\'')) {
          JsonLexer::ParseUtf8
                    ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     ,lex);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)&any_lex,
                      &key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
LAB_002906a0:
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::~StatusOrData(&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         );
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&any_lex);
          if (*(long *)this != 1) goto LAB_00290806;
          absl::lts_20240722::Status::~Status((Status *)this);
          JsonLexer::Expect((JsonLexer *)this,lex,1,":");
          if (*(long *)this != 1) goto LAB_00290806;
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
          ::EnsureOk((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                      *)&any_lex);
          bVar14 = json_internal::operator==
                             ((MaybeOwnedString *)&any_lex.stream_.last_chunk_,(char (*) [6])"@type"
                             );
          if (bVar14) {
            if (type_url.
                super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                ._M_payload.
                super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>.
                _M_engaged == true) {
              JsonLocation::Invalid
                        ((JsonLocation *)this,&any_lex.stream_.cursor_,0x15,"repeated @type in Any")
              ;
            }
            else {
              JsonLexer::ParseUtf8
                        ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          *)&key.
                             super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         ,lex);
              absl::lts_20240722::Status::Status
                        ((Status *)this,
                         (Status *)
                         &key.
                          super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        );
              if (*(long *)this == 1) {
                absl::lts_20240722::Status::~Status((Status *)this);
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::EnsureOk(&key.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          );
                std::optional<google::protobuf::json_internal::MaybeOwnedString>::operator=
                          (&type_url,
                           &key.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_1.data_.value);
                *(undefined8 *)this = 1;
              }
              absl::lts_20240722::internal_statusor::
              StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
              ::~StatusOrData(&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                             );
            }
          }
          else {
            JsonLexer::SkipValue((JsonLexer *)this);
          }
          if (*(long *)this != 1) goto LAB_00290806;
          absl::lts_20240722::Status::~Status((Status *)this);
          literal_03._M_str = ",";
          literal_03._M_len = 1;
          bVar12 = JsonLexer::Peek(lex,literal_03);
          bVar14 = true;
        }
        else {
          if ((lex->options_).allow_legacy_syntax == true) {
            JsonLexer::ParseBareWord
                      ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                        *)&key.
                           super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       ,lex);
            absl::lts_20240722::internal_statusor::
            StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
            ::operator=((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&any_lex,
                        &key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       );
            goto LAB_002906a0;
          }
          JsonLocation::Invalid((JsonLocation *)this,&lex->json_loc_,0xc,"expected \'\"\'");
LAB_00290806:
          bVar14 = false;
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
        ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         *)&any_lex);
        if (!bVar14) goto LAB_00290869;
        literal_04._M_str = "}";
        literal_04._M_len = 1;
        bVar14 = JsonLexer::Peek(lex,literal_04);
      } while (!bVar14);
      piVar1 = &(lex->options_).recursion_depth;
      *piVar1 = *piVar1 + 1;
      if (((lex->options_).allow_legacy_syntax != false) || (bVar12 == false)) goto LAB_0028f5ab;
      local_280 = "expected \'}\'";
LAB_00290853:
      JsonLocation::Invalid((JsonLocation *)this,&lex->json_loc_,0xc,local_280);
LAB_00290869:
      if (*(long *)this != 1) goto LAB_00290d4c;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    Mark::UpToUnread((MaybeOwnedString *)&key,&mark.value,0);
    sVar38 = MaybeOwnedString::AsView((MaybeOwnedString *)&key);
    MaybeOwnedString::~MaybeOwnedString((MaybeOwnedString *)&key);
    io::ArrayInputStream::ArrayInputStream(&in,sVar38._M_str,(int)sVar38._M_len,-1);
    any_lex.json_loc_.path = lex->path_;
    any_lex.stream_.outstanding_buffer_borrows_ = 0;
    any_lex.stream_.last_chunk_._M_len._0_4_ = 0;
    any_lex.stream_.last_chunk_._M_len._4_4_ = 0;
    any_lex.stream_.last_chunk_._M_str._0_1_ = 0;
    any_lex.stream_.last_chunk_._M_str._1_7_ = 0;
    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    any_lex.stream_._44_5_ = 0;
    any_lex.stream_.cursor_ = 0;
    any_lex.stream_.buffer_start_ = 0;
    any_lex.stream_.eof_ = false;
    any_lex.options_.ignore_unknown_fields = (lex->options_).ignore_unknown_fields;
    any_lex.options_.case_insensitive_enum_parsing = (lex->options_).case_insensitive_enum_parsing;
    any_lex.options_._2_2_ = *(undefined2 *)&(lex->options_).field_0x2;
    any_lex.options_.recursion_depth = (lex->options_).recursion_depth;
    any_lex.options_.allow_legacy_syntax = (lex->options_).allow_legacy_syntax;
    any_lex.options_._9_3_ = *(undefined3 *)&(lex->options_).field_0x9;
    any_lex.json_loc_.offset._0_4_ = (undefined4)mark.loc.offset;
    any_lex.json_loc_.offset._4_4_ = mark.loc.offset._4_4_;
    any_lex.json_loc_.line._0_4_ = (undefined4)mark.loc.line;
    any_lex.json_loc_.line._4_4_ = mark.loc.line._4_4_;
    any_lex.json_loc_.col = mark.loc.col;
    any_lex.path_ = any_lex.json_loc_.path;
    any_lex.stream_.stream_ = &in.super_ZeroCopyInputStream;
    if (type_url.
        super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>.
        _M_payload.
        super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
        .super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>._M_engaged
        == false) {
      if ((lex->options_).allow_legacy_syntax == false) {
        JsonLocation::Invalid((JsonLocation *)this,&mark.loc,0x14,"missing @type in Any");
      }
      else {
        JsonLexer::Expect((JsonLexer *)this,&any_lex,1,"{");
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          JsonLexer::Push((JsonLexer *)this);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            literal_05._M_str = "}";
            literal_05._M_len = 1;
            bVar12 = JsonLexer::Peek(&any_lex,literal_05);
            if (bVar12) {
              any_lex.options_.recursion_depth = any_lex.options_.recursion_depth + 1;
LAB_00290967:
              *(undefined8 *)this = 1;
            }
            else {
              bVar12 = true;
              do {
                if (bVar12 == false) {
                  pcVar29 = "expected \',\'";
                  goto LAB_002911e0;
                }
                JsonLexer::SkipToToken((JsonLexer *)this);
                if (*(long *)this != 1) goto LAB_00290d3b;
                absl::lts_20240722::Status::~Status((Status *)this);
                absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            *)&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                          );
                cVar13 = ZeroCopyBufferedStream::PeekChar(&any_lex.stream_);
                if (cVar13 == '\"') {
LAB_00290f3a:
                  JsonLexer::ParseUtf8
                            ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)&out,&any_lex);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::operator=(&key.
                               super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)&out);
LAB_00290f50:
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::~StatusOrData((StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                   *)&out);
                  absl::lts_20240722::Status::Status
                            ((Status *)this,
                             (Status *)
                             &key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  if (*(long *)this != 1) goto LAB_00291028;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  JsonLexer::Expect((JsonLexer *)this,&any_lex,1,":");
                  if (*(long *)this != 1) goto LAB_00291028;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                  ::EnsureOk(&key.
                              super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            );
                  JsonLocation::Invalid
                            ((JsonLocation *)this,&mark.loc,0x48,
                             "in legacy mode, missing @type in Any is only allowed for an empty object"
                            );
                  if (*(long *)this != 1) goto LAB_00291028;
                  absl::lts_20240722::Status::~Status((Status *)this);
                  literal_06._M_str = ",";
                  literal_06._M_len = 1;
                  bVar12 = JsonLexer::Peek(&any_lex,literal_06);
                  bVar14 = true;
                }
                else {
                  cVar13 = ZeroCopyBufferedStream::PeekChar(&any_lex.stream_);
                  if (cVar13 == '\'') goto LAB_00290f3a;
                  if (any_lex.options_.allow_legacy_syntax == true) {
                    JsonLexer::ParseBareWord
                              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                *)&out,&any_lex);
                    absl::lts_20240722::internal_statusor::
                    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                    ::operator=(&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                ,(StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                                  *)&out);
                    goto LAB_00290f50;
                  }
                  JsonLocation::Invalid
                            ((JsonLocation *)this,&any_lex.json_loc_,0xc,"expected \'\"\'");
LAB_00291028:
                  bVar14 = false;
                }
                absl::lts_20240722::internal_statusor::
                StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::~StatusOrData(&key.
                                 super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                               );
                if (!bVar14) goto LAB_002911f4;
                literal_07._M_str = "}";
                literal_07._M_len = 1;
                bVar14 = JsonLexer::Peek(&any_lex,literal_07);
              } while (!bVar14);
              any_lex.options_.recursion_depth = any_lex.options_.recursion_depth + 1;
              if ((any_lex.options_.allow_legacy_syntax != false) || (bVar12 == false))
              goto LAB_00290967;
              pcVar29 = "expected \'}\'";
LAB_002911e0:
              JsonLocation::Invalid((JsonLocation *)this,&any_lex.json_loc_,0xc,pcVar29);
LAB_002911f4:
              if (*(long *)this != 1) goto LAB_00290d3b;
            }
            absl::lts_20240722::Status::~Status((Status *)this);
            *(undefined8 *)this = 1;
          }
        }
      }
    }
    else {
      pFVar18 = Proto3Type::MustHaveField(desc,1);
      sVar38 = MaybeOwnedString::AsView((MaybeOwnedString *)&type_url);
      x._M_str = pcVar29;
      x._M_len = (size_t)sVar38._M_str;
      ParseProto3Type::SetString((ParseProto3Type *)pFVar18,(Field)msg,(Msg *)sVar38._M_len,x);
      pFVar18 = Proto3Type::MustHaveField(desc,2);
      psVar19 = MaybeOwnedString::ToString_abi_cxx11_((MaybeOwnedString *)&type_url);
      local_110._0_8_ = &any_lex;
      ParseProto3Type::RecordAsSeen(pFVar18,msg);
      url._M_str = (char *)psVar19->_M_string_length;
      url._M_len = (size_t)pFVar18->parent_->pool_;
      ResolverPool::FindMessage((ResolverPool *)(local_110 + 8),url);
      absl::lts_20240722::Status::Status((Status *)this,(Status *)(local_110 + 8));
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   (local_110 + 8));
        if ((pFVar18->raw_->field_0)._impl_.kind_ == 10) {
          io::CodedOutputStream::WriteVarint32
                    (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 3);
          ParseAny<google::protobuf::json_internal::ParseProto3Type>::anon_class_8_1_5121a82c::
          operator()((anon_class_8_1_5121a82c *)this,
                     (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_110,
                     (Msg<google::protobuf::json_internal::ParseProto3Type> *)local_100.ptr_);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            io::CodedOutputStream::WriteVarint32
                      (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 4);
            *(undefined8 *)this = 1;
          }
        }
        else {
          out._M_string_length = 0;
          out._M_dataplus._M_p = (pointer)&out.field_2;
          out.field_2._M_local_buf[0] = '\0';
          io::StringOutputStream::StringOutputStream(&stream,&out);
          ParseProto3Type::Msg::Msg((Msg *)&key,&stream.super_ZeroCopyOutputStream);
          ParseAny<google::protobuf::json_internal::ParseProto3Type>::anon_class_8_1_5121a82c::
          operator()((anon_class_8_1_5121a82c *)this,
                     (Desc<google::protobuf::json_internal::ParseProto3Type> *)local_110,
                     (Msg<google::protobuf::json_internal::ParseProto3Type> *)local_100.ptr_);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            io::CodedOutputStream::Trim((CodedOutputStream *)&key);
            _Var10._M_p = out._M_dataplus._M_p;
            iVar16 = io::CodedOutputStream::ByteCount((CodedOutputStream *)&key);
            x_04._M_str = pcVar29;
            x_04._M_len = (size_t)_Var10._M_p;
            ParseProto3Type::SetString
                      ((ParseProto3Type *)pFVar18,(Field)msg,(Msg *)(long)iVar16,x_04);
            *(undefined8 *)this = 1;
          }
          ParseProto3Type::Msg::~Msg((Msg *)&key);
          std::__cxx11::string::~string((string *)&out);
        }
      }
      absl::lts_20240722::Status::~Status((Status *)(local_110 + 8));
    }
LAB_00290d3b:
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&any_lex.stream_.buf_.super__Vector_base<char,_std::allocator<char>_>);
LAB_00290d4c:
    std::_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>::_M_reset
              ((_Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString> *)
               &type_url);
    BufferingGuard::~BufferingGuard(&mark.value.guard_);
    return (Status)this;
  }
  JsonLexer::PeekKind((JsonLexer *)&mark);
  absl::lts_20240722::Status::Status((Status *)this,(Status *)&mark);
  if (*(long *)this != 1) goto LAB_00290ba5;
  absl::lts_20240722::Status::~Status((Status *)this);
  absl::lts_20240722::internal_statusor::
  StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
            ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&mark);
  switch((int)mark.value.guard_.owner_) {
  case 0:
    pFVar18 = Proto3Type::MustHaveField(desc,5);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    pvVar4 = (pFVar18->raw_->field_0)._impl_.type_url_.tagged_ptr_.ptr_;
    ParseProto3Type::RecordAsSeen(pFVar18,msg);
    url_00._M_str = *(char **)(((ulong)pvVar4 & 0xfffffffffffffffc) + 8);
    url_00._M_len = (size_t)pFVar18->parent_->pool_;
    ResolverPool::FindMessage((ResolverPool *)&type_url,url_00);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&type_url);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                 &type_url);
      if ((pFVar18->raw_->field_0)._impl_.kind_ == 10) {
        io::CodedOutputStream::WriteVarint32
                  (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 3);
        ParseStructValue<google::protobuf::json_internal::ParseProto3Type>
                  (this,lex,(Desc<google::protobuf::json_internal::ParseProto3Type> *)
                            type_url.
                            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                            ._M_payload._8_8_,msg);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          io::CodedOutputStream::WriteVarint32
                    (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 4);
LAB_0029056e:
          *(undefined8 *)this = 1;
        }
      }
      else {
        any_lex.stream_.stream_ = (ZeroCopyInputStream *)&any_lex.stream_.last_chunk_._M_str;
        any_lex.stream_.last_chunk_._M_len._0_4_ = 0;
        any_lex.stream_.last_chunk_._M_len._4_4_ = 0;
        any_lex.stream_.last_chunk_._M_str._0_1_ = 0;
        io::StringOutputStream::StringOutputStream((StringOutputStream *)&out,(string *)&any_lex);
        ParseProto3Type::Msg::Msg((Msg *)&key,(ZeroCopyOutputStream *)&out);
        ParseStructValue<google::protobuf::json_internal::ParseProto3Type>
                  (this,lex,(Desc<google::protobuf::json_internal::ParseProto3Type> *)
                            type_url.
                            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                            ._M_payload._8_8_,
                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)&key);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          io::CodedOutputStream::Trim((CodedOutputStream *)&key);
          pZVar8 = any_lex.stream_.stream_;
          iVar16 = io::CodedOutputStream::ByteCount((CodedOutputStream *)&key);
          x_02._M_str = pcVar29;
          x_02._M_len = (size_t)pZVar8;
          ParseProto3Type::SetString((ParseProto3Type *)pFVar18,(Field)msg,(Msg *)(long)iVar16,x_02)
          ;
LAB_00290b71:
          *(undefined8 *)this = 1;
        }
LAB_00290b7c:
        ParseProto3Type::Msg::~Msg((Msg *)&key);
        std::__cxx11::string::~string((string *)&any_lex);
      }
    }
    goto LAB_00290b93;
  case 1:
    pFVar18 = Proto3Type::MustHaveField(desc,6);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    pvVar4 = (pFVar18->raw_->field_0)._impl_.type_url_.tagged_ptr_.ptr_;
    ParseProto3Type::RecordAsSeen(pFVar18,msg);
    url_01._M_str = *(char **)(((ulong)pvVar4 & 0xfffffffffffffffc) + 8);
    url_01._M_len = (size_t)pFVar18->parent_->pool_;
    ResolverPool::FindMessage((ResolverPool *)&type_url,url_01);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&type_url);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                 &type_url);
      if ((pFVar18->raw_->field_0)._impl_.kind_ != 10) {
        any_lex.stream_.stream_ = (ZeroCopyInputStream *)&any_lex.stream_.last_chunk_._M_str;
        any_lex.stream_.last_chunk_._M_len._0_4_ = 0;
        any_lex.stream_.last_chunk_._M_len._4_4_ = 0;
        any_lex.stream_.last_chunk_._M_str._0_1_ = 0;
        io::StringOutputStream::StringOutputStream((StringOutputStream *)&out,(string *)&any_lex);
        ParseProto3Type::Msg::Msg((Msg *)&key,(ZeroCopyOutputStream *)&out);
        ParseListValue<google::protobuf::json_internal::ParseProto3Type>
                  (this,lex,(Desc<google::protobuf::json_internal::ParseProto3Type> *)
                            type_url.
                            super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                            ._M_payload.
                            super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                            .
                            super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                            ._M_payload._8_8_,
                   (Msg<google::protobuf::json_internal::ParseProto3Type> *)&key);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          io::CodedOutputStream::Trim((CodedOutputStream *)&key);
          pZVar8 = any_lex.stream_.stream_;
          iVar16 = io::CodedOutputStream::ByteCount((CodedOutputStream *)&key);
          x_03._M_str = pcVar29;
          x_03._M_len = (size_t)pZVar8;
          ParseProto3Type::SetString((ParseProto3Type *)pFVar18,(Field)msg,(Msg *)(long)iVar16,x_03)
          ;
          goto LAB_00290b71;
        }
        goto LAB_00290b7c;
      }
      io::CodedOutputStream::WriteVarint32
                (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 3);
      ParseListValue<google::protobuf::json_internal::ParseProto3Type>
                (this,lex,(Desc<google::protobuf::json_internal::ParseProto3Type> *)
                          type_url.
                          super__Optional_base<google::protobuf::json_internal::MaybeOwnedString,_false,_false>
                          ._M_payload.
                          super__Optional_payload<google::protobuf::json_internal::MaybeOwnedString,_true,_false,_false>
                          .
                          super__Optional_payload_base<google::protobuf::json_internal::MaybeOwnedString>
                          ._M_payload._8_8_,msg);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        io::CodedOutputStream::WriteVarint32
                  (&msg->stream_,(pFVar18->raw_->field_0)._impl_.number_ * 8 + 4);
        goto LAB_0029056e;
      }
    }
LAB_00290b93:
    this_01 = (StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
               *)&type_url;
LAB_00290b9b:
    absl::lts_20240722::Status::~Status((Status *)this_01);
    break;
  case 2:
    pFVar18 = Proto3Type::MustHaveField(desc,3);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::ParseUtf8(&key,lex);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::EnsureOk(&key.
                  super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                );
      psVar19 = MaybeOwnedString::ToString_abi_cxx11_
                          (&key.
                            super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                            .field_1.data_.value);
      x_01._M_str = pcVar29;
      x_01._M_len = (size_t)(psVar19->_M_dataplus)._M_p;
      ParseProto3Type::SetString
                ((ParseProto3Type *)pFVar18,(Field)msg,(Msg *)psVar19->_M_string_length,x_01);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
      ::~StatusOrData(&key.
                       super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                     );
LAB_002908bd:
      ppCVar3 = &(pMVar35->components_).
                 super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar3 = *ppCVar3 + -1;
      goto switchD_0028f857_default;
    }
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOrData(&key.
                     super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                   );
    break;
  case 3:
    pFVar18 = Proto3Type::MustHaveField(desc,2);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)&key,lex);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&key);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<google::protobuf::json_internal::LocationWith<double>_>::EnsureOk
                ((StatusOrData<google::protobuf::json_internal::LocationWith<double>_> *)&key);
      ParseProto3Type::SetDouble
                (pFVar18,msg,
                 (double)key.
                         super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                         .field_1._0_8_);
      absl::lts_20240722::Status::~Status((Status *)&key);
      goto LAB_002908bd;
    }
    this_01 = &key;
    goto LAB_00290b9b;
  case 4:
  case 5:
    pFVar18 = Proto3Type::MustHaveField(desc,4);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    absl::lts_20240722::internal_statusor::
    StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>::EnsureOk
              ((StatusOrData<google::protobuf::json_internal::JsonLexer::Kind> *)&mark);
    if ((int)mark.value.guard_.owner_ == 4) {
      JsonLexer::Expect((JsonLexer *)this,lex,4,"true");
    }
    else {
      JsonLexer::Expect((JsonLexer *)this,lex,5,"false");
    }
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto3Type::SetBool(pFVar18,msg,(int)mark.value.guard_.owner_ == 4);
      goto LAB_002908bd;
    }
    break;
  case 6:
    pFVar18 = Proto3Type::MustHaveField(desc,1);
    pMVar35 = lex->path_;
    puVar30 = (undefined8 *)
              ((ulong)(pFVar18->raw_->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    uVar5 = *puVar30;
    uVar6 = puVar30[1];
    iVar16 = (pFVar18->raw_->field_0)._impl_.kind_;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._0_16_ = (undefined1  [16])Proto3Type::FieldTypeName(pFVar18);
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._32_4_ = 0xffffffff;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_0.status_.rep_._0_4_ = iVar16;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._16_8_ = uVar6;
    key.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1._24_8_ = uVar5;
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::emplace_back<google::protobuf::json_internal::MessagePath::Component>
              (&pMVar35->components_,(Component *)&key);
    JsonLexer::Expect((JsonLexer *)this,lex,4,"null");
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      ParseProto3Type::SetEnum(pFVar18,msg,0);
      goto LAB_002908bd;
    }
    break;
  default:
switchD_0028f857_default:
    *(undefined8 *)this = 1;
    goto LAB_00290ba5;
  }
  ppCVar3 = &(pMVar35->components_).
             super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar3 = *ppCVar3 + -1;
LAB_00290ba5:
  absl::lts_20240722::Status::~Status((Status *)&mark);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseMessage(JsonLexer& lex, const Desc<Traits>& desc,
                          Msg<Traits>& msg, bool any_reparse) {
  MessageType type = ClassifyMessage(Traits::TypeName(desc));
  if (!any_reparse) {
    switch (type) {
      case MessageType::kAny:
        return ParseAny<Traits>(lex, desc, msg);
      case MessageType::kValue:
        return ParseValue<Traits>(lex, desc, msg);
      case MessageType::kStruct:
        return ParseStructValue<Traits>(lex, desc, msg);
      default:
        break;
    }
    // For some types, the ESF parser permits parsing the "non-special" version.
    // It is not clear if this counts as out-of-spec, but we're treating it as
    // such.
    bool is_upcoming_object = lex.Peek(JsonLexer::kObj);
    if (!(is_upcoming_object && lex.options().allow_legacy_syntax)) {
      switch (type) {
        case MessageType::kList:
          return ParseListValue<Traits>(lex, desc, msg);
        case MessageType::kWrapper: {
          return ParseSingular<Traits>(lex, Traits::MustHaveField(desc, 1),
                                       msg);
        }
        case MessageType::kTimestamp:
          return ParseTimestamp<Traits>(lex, desc, msg);
        case MessageType::kDuration:
          return ParseDuration<Traits>(lex, desc, msg);
        case MessageType::kFieldMask:
          return ParseFieldMask<Traits>(lex, desc, msg);
        default:
          break;
      }
    }
  }

  return lex.VisitObject(
      [&](LocationWith<MaybeOwnedString>& name) -> absl::Status {
        // If this is a well-known type, we expect its contents to be inside
        // of a JSON field named "value".
        if (any_reparse) {
          if (name.value == "@type") {
            RETURN_IF_ERROR(lex.SkipValue());
            return absl::OkStatus();
          }
          if (type != MessageType::kNotWellKnown) {
            if (name.value != "value") {
              return lex.Invalid(
                  "fields in a well-known-typed Any must be @type or value");
            }
            // Parse the upcoming value as the message itself. This is *not*
            // an Any reparse because we do not expect to see @type in the
            // upcoming value.
            return ParseMessage<Traits>(lex, desc, msg,
                                        /*any_reparse=*/false);
          }
        }

        return ParseField<Traits>(lex, desc, name.value.ToString(), msg);
      });
}